

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optCompare_optNotEmptyValueGreater_Test::~optCompare_optNotEmptyValueGreater_Test
          (optCompare_optNotEmptyValueGreater_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, optNotEmptyValueGreater)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i{2};
  EXPECT_FALSE(i == 1);
  EXPECT_TRUE(i != 1);
  EXPECT_FALSE(i < 1);
  EXPECT_TRUE(i > 1);
  EXPECT_FALSE(i <= 1);
  EXPECT_TRUE(i >= 1);
}